

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptIntBounds.cpp
# Opt level: O0

void __thiscall
GlobOpt::TrackIntSpecializedAddSubConstant
          (GlobOpt *this,Instr *instr,AddSubConstantInfo *addSubConstantInfo,Value *dstValue,
          bool updateSourceBounds)

{
  BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *this_00;
  code *pcVar1;
  IntConstantBounds valueInfo_00;
  InductionVariable *this_01;
  bool bVar2;
  BOOLEAN BVar3;
  ValueNumber VVar4;
  ValueNumber VVar5;
  int32 iVar6;
  undefined4 *puVar7;
  Opnd *pOVar8;
  RegOpnd *pRVar9;
  StackSym *pSVar10;
  StackSym *pSVar11;
  Value *pVVar12;
  ValueInfo *this_02;
  IntBoundedValueInfo *newValueInfo;
  InductionVariable *local_c0;
  InductionVariable *inductionVariable;
  int32 dstOffset;
  ValueNumber valueNumber;
  IntBounds *bounds;
  IntConstantBounds constantBounds;
  ValueInfo *valueInfo;
  Value *value_1;
  Value *local_78;
  Value *landingPadValue;
  InductionVariable *inductionVariable_1;
  InductionVariableSet *inductionVariables;
  Value *value;
  Instr *pIStack_50;
  ValueNumber srcValueNumber;
  Instr *nextInstr;
  Instr *prevInstr;
  StackSym *pSStack_38;
  bool isPostfixIncDecPattern;
  StackSym *sym;
  Value *pVStack_28;
  bool updateSourceBounds_local;
  Value *dstValue_local;
  AddSubConstantInfo *addSubConstantInfo_local;
  Instr *instr_local;
  GlobOpt *this_local;
  
  sym._7_1_ = updateSourceBounds;
  pVStack_28 = dstValue;
  dstValue_local = (Value *)addSubConstantInfo;
  addSubConstantInfo_local = (AddSubConstantInfo *)instr;
  instr_local = (Instr *)this;
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x2c6,"(instr)","instr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if (pVStack_28 == (Value *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x2c7,"(dstValue)","dstValue");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if (dstValue_local == (Value *)0x0) {
    if ((*(uint *)&this->field_0xf4 >> 6 & 1) == 0) {
      return;
    }
    *(uint *)&this->field_0xf4 = *(uint *)&this->field_0xf4 & 0xffffffbf;
    bVar2 = IsLoopPrePass(this);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x375,"(IsLoopPrePass())","IsLoopPrePass()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    if (*(short *)&addSubConstantInfo_local[2].srcSym != 0x45) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x376,"(instr->m_opcode == Js::OpCode::Ld_A)",
                         "instr->m_opcode == Js::OpCode::Ld_A");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    if ((((*(short *)&(addSubConstantInfo_local[1].srcSym)->m_tempNumberSym != 0x26) &&
         (*(short *)&(addSubConstantInfo_local[1].srcSym)->m_tempNumberSym != 0x27)) &&
        (*(short *)&(addSubConstantInfo_local[1].srcSym)->m_tempNumberSym != 0x2d)) &&
       (*(short *)&(addSubConstantInfo_local[1].srcSym)->m_tempNumberSym != 0x33)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x37b,
                         "(instr->m_prev->m_opcode == Js::OpCode::Incr_A || instr->m_prev->m_opcode == Js::OpCode::Decr_A || instr->m_prev->m_opcode == Js::OpCode::Add_A || instr->m_prev->m_opcode == Js::OpCode::Sub_A)"
                         ,
                         "instr->m_prev->m_opcode == Js::OpCode::Incr_A || instr->m_prev->m_opcode == Js::OpCode::Decr_A || instr->m_prev->m_opcode == Js::OpCode::Add_A || instr->m_prev->m_opcode == Js::OpCode::Sub_A"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    pOVar8 = IR::Instr::GetDst((Instr *)addSubConstantInfo_local[1].srcSym);
    pRVar9 = IR::Opnd::AsRegOpnd(pOVar8);
    pSVar10 = pRVar9->m_sym;
    pOVar8 = IR::Instr::GetSrc1((Instr *)addSubConstantInfo_local);
    pRVar9 = IR::Opnd::AsRegOpnd(pOVar8);
    if (pSVar10 != pRVar9->m_sym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x37c,
                         "(instr->m_prev->GetDst()->AsRegOpnd()->m_sym == instr->GetSrc1()->AsRegOpnd()->m_sym)"
                         ,
                         "instr->m_prev->GetDst()->AsRegOpnd()->m_sym == instr->GetSrc1()->AsRegOpnd()->m_sym"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    this_00 = &((this->currentBlock->globOptData).inductionVariables)->
               super_BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
    ;
    pOVar8 = IR::Instr::GetDst((Instr *)addSubConstantInfo_local);
    pRVar9 = IR::Opnd::AsRegOpnd(pOVar8);
    bVar2 = JsUtil::
            BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
            ::TryGetReference<unsigned_int>(this_00,&(pRVar9->m_sym->super_Sym).m_id,&local_c0);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x37f,
                         "(currentBlock->globOptData.inductionVariables->TryGetReference(instr->GetDst()->AsRegOpnd()->m_sym->m_id, &inductionVariable))"
                         ,
                         "currentBlock->globOptData.inductionVariables->TryGetReference(instr->GetDst()->AsRegOpnd()->m_sym->m_id, &inductionVariable)"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    VVar5 = ::Value::GetValueNumber(pVStack_28);
    InductionVariable::SetSymValueNumber(local_c0,VVar5);
    return;
  }
  bVar2 = AddSubConstantInfo::HasInfo((AddSubConstantInfo *)dstValue_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x2cb,"(addSubConstantInfo->HasInfo())","addSubConstantInfo->HasInfo()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if ((*(uint *)&this->field_0xf4 >> 2 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x2cc,"(!ignoredIntOverflowForCurrentInstr)",
                       "!ignoredIntOverflowForCurrentInstr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  bVar2 = IsLoopPrePass(this);
  if ((!bVar2) || (bVar2 = DoBoundCheckHoist(this), !bVar2)) goto LAB_0060df94;
  if (((*(short *)&addSubConstantInfo_local[2].srcSym != 0x26) &&
      ((*(short *)&addSubConstantInfo_local[2].srcSym != 0x27 &&
       (*(short *)&addSubConstantInfo_local[2].srcSym != 0x2d)))) &&
     (*(short *)&addSubConstantInfo_local[2].srcSym != 0x33)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x2d8,
                       "(instr->m_opcode == Js::OpCode::Incr_A || instr->m_opcode == Js::OpCode::Decr_A || instr->m_opcode == Js::OpCode::Add_A || instr->m_opcode == Js::OpCode::Sub_A)"
                       ,
                       "instr->m_opcode == Js::OpCode::Incr_A || instr->m_opcode == Js::OpCode::Decr_A || instr->m_opcode == Js::OpCode::Add_A || instr->m_opcode == Js::OpCode::Sub_A"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  pOVar8 = IR::Instr::GetDst((Instr *)addSubConstantInfo_local);
  pRVar9 = IR::Opnd::AsRegOpnd(pOVar8);
  pSStack_38 = pRVar9->m_sym;
  prevInstr._7_1_ = 0;
  pSVar10 = AddSubConstantInfo::SrcSym((AddSubConstantInfo *)dstValue_local);
  if (pSVar10 != pSStack_38) {
    nextInstr = (Instr *)addSubConstantInfo_local[1].srcSym;
    if (nextInstr == (Instr *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x2e8,"(prevInstr)","prevInstr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    if (nextInstr->m_opcode == Conv_Num) {
      pOVar8 = IR::Instr::GetSrc1(nextInstr);
      bVar2 = IR::Opnd::IsRegOpnd(pOVar8);
      if (bVar2) {
        pOVar8 = IR::Instr::GetSrc1(nextInstr);
        pRVar9 = IR::Opnd::AsRegOpnd(pOVar8);
        if (pRVar9->m_sym == pSStack_38) {
          pOVar8 = IR::Instr::GetDst(nextInstr);
          pRVar9 = IR::Opnd::AsRegOpnd(pOVar8);
          pSVar10 = pRVar9->m_sym;
          pSVar11 = AddSubConstantInfo::SrcSym((AddSubConstantInfo *)dstValue_local);
          if (pSVar10 == pSVar11) {
            prevInstr._7_1_ = 1;
            goto LAB_0060dc08;
          }
        }
      }
    }
    pIStack_50 = *(Instr **)&addSubConstantInfo_local->srcValueIsLikelyConstant;
    if (pIStack_50 == (Instr *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x2f6,"(nextInstr)","nextInstr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    if (pIStack_50->m_opcode != Ld_A) goto LAB_0060df94;
    pOVar8 = IR::Instr::GetSrc1(pIStack_50);
    bVar2 = IR::Opnd::IsRegOpnd(pOVar8);
    if (!bVar2) goto LAB_0060df94;
    pOVar8 = IR::Instr::GetSrc1(pIStack_50);
    pRVar9 = IR::Opnd::AsRegOpnd(pOVar8);
    if (pRVar9->m_sym != pSStack_38) goto LAB_0060df94;
    pSStack_38 = AddSubConstantInfo::SrcSym((AddSubConstantInfo *)dstValue_local);
    pOVar8 = IR::Instr::GetDst(pIStack_50);
    pRVar9 = IR::Opnd::AsRegOpnd(pOVar8);
    if (pRVar9->m_sym != pSStack_38) goto LAB_0060df94;
    *(uint *)&this->field_0xf4 = *(uint *)&this->field_0xf4 & 0xffffffbf | 0x40;
  }
LAB_0060dc08:
  if ((prevInstr._7_1_ & 1) == 0) {
    pVVar12 = AddSubConstantInfo::SrcValue((AddSubConstantInfo *)dstValue_local);
    value._4_4_ = ::Value::GetValueNumber(pVVar12);
  }
  else {
    inductionVariables =
         (InductionVariableSet *)
         GlobOptBlockData::FindValue(&this->currentBlock->globOptData,&pSStack_38->super_Sym);
    if ((Value *)inductionVariables == (Value *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x310,"(value)","value");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    value._4_4_ = ::Value::GetValueNumber((Value *)inductionVariables);
  }
  inductionVariable_1 = (InductionVariable *)(this->currentBlock->globOptData).inductionVariables;
  if (inductionVariable_1 == (InductionVariable *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x318,"(inductionVariables)","inductionVariables");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  bVar2 = JsUtil::
          BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
          ::TryGetReference<unsigned_int>
                    ((BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                      *)inductionVariable_1,&(pSStack_38->super_Sym).m_id,
                     (InductionVariable **)&landingPadValue);
  if (bVar2) {
    bVar2 = InductionVariable::IsChangeDeterminate((InductionVariable *)landingPadValue);
    VVar5 = value._4_4_;
    if (bVar2) {
      VVar4 = InductionVariable::SymValueNumber((InductionVariable *)landingPadValue);
      pVVar12 = landingPadValue;
      if (VVar5 == VVar4) {
        VVar5 = ::Value::GetValueNumber(pVStack_28);
        InductionVariable::SetSymValueNumber((InductionVariable *)pVVar12,VVar5);
        if (this->prePassLoop == this->currentBlock->loop) {
          iVar6 = AddSubConstantInfo::Offset((AddSubConstantInfo *)dstValue_local);
          bVar2 = InductionVariable::Add((InductionVariable *)landingPadValue,iVar6);
          if (!bVar2) {
            *(uint *)&this->field_0xf4 = *(uint *)&this->field_0xf4 & 0xffffffbf;
          }
        }
      }
      else {
        InductionVariable::SetChangeIsIndeterminate((InductionVariable *)landingPadValue);
        *(uint *)&this->field_0xf4 = *(uint *)&this->field_0xf4 & 0xffffffbf;
      }
    }
    else {
      *(uint *)&this->field_0xf4 = *(uint *)&this->field_0xf4 & 0xffffffbf;
    }
  }
  else if (this->prePassLoop == this->currentBlock->loop) {
    local_78 = GlobOptBlockData::FindValue
                         (&this->currentBlock->loop->landingPad->globOptData,&pSStack_38->super_Sym)
    ;
    VVar5 = value._4_4_;
    if (((local_78 == (Value *)0x0) || (VVar4 = ::Value::GetValueNumber(local_78), VVar5 != VVar4))
       || (BVar3 = BVSparse<Memory::JitArenaAllocator>::Test
                             (this->currentBlock->loop->symsDefInLoop,(pSStack_38->super_Sym).m_id),
          pSVar10 = pSStack_38, this_01 = inductionVariable_1, BVar3 != '\0')) {
      *(uint *)&this->field_0xf4 = *(uint *)&this->field_0xf4 & 0xffffffbf;
    }
    else {
      VVar5 = ::Value::GetValueNumber(pVStack_28);
      iVar6 = AddSubConstantInfo::Offset((AddSubConstantInfo *)dstValue_local);
      InductionVariable::InductionVariable((InductionVariable *)&value_1,pSVar10,VVar5,iVar6);
      JsUtil::
      BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
      ::Add((BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
             *)this_01,(InductionVariable *)&value_1);
    }
  }
  else {
    *(uint *)&this->field_0xf4 = *(uint *)&this->field_0xf4 & 0xffffffbf;
  }
LAB_0060df94:
  bVar2 = IsLoopPrePass(this);
  if (((!bVar2) && ((sym._7_1_ & 1) != 0)) &&
     (iVar6 = AddSubConstantInfo::Offset((AddSubConstantInfo *)dstValue_local), iVar6 != -0x80000000
     )) {
    pVVar12 = AddSubConstantInfo::SrcValue((AddSubConstantInfo *)dstValue_local);
    constantBounds = (IntConstantBounds)::Value::GetValueInfo(pVVar12);
    bVar2 = ValueType::IsInt((ValueType *)((long)constantBounds + 8));
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x355,"(valueInfo->IsInt())","valueInfo->IsInt()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    IntConstantBounds::IntConstantBounds((IntConstantBounds *)&bounds);
    bVar2 = ValueInfo::TryGetIntConstantBounds
                      ((ValueInfo *)constantBounds,(IntConstantBounds *)&bounds,false);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x357,"(valueInfo->TryGetIntConstantBounds(&constantBounds))",
                         "valueInfo->TryGetIntConstantBounds(&constantBounds)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    valueInfo_00 = constantBounds;
    this_02 = ::Value::GetValueInfo(pVStack_28);
    bVar2 = ValueInfo::HasIntConstantValue(this_02,false);
    _dstOffset = GetIntBoundsToUpdate
                           (this,(ValueInfo *)valueInfo_00,(IntConstantBounds *)&bounds,true,bVar2,
                            true,true);
    if (_dstOffset != (IntBounds *)0x0) {
      inductionVariable._4_4_ = ::Value::GetValueNumber(pVVar12);
      iVar6 = AddSubConstantInfo::Offset((AddSubConstantInfo *)dstValue_local);
      inductionVariable._0_4_ = -iVar6;
      IntBounds::SetLowerBound
                (_dstOffset,inductionVariable._4_4_,pVStack_28,(int)inductionVariable,true);
      IntBounds::SetUpperBound
                (_dstOffset,inductionVariable._4_4_,pVStack_28,(int)inductionVariable,true);
      newValueInfo = NewIntBoundedValueInfo(this,(ValueInfo *)constantBounds,_dstOffset);
      ChangeValueInfo(this,(BasicBlock *)0x0,pVVar12,&newValueInfo->super_ValueInfo,false,false);
    }
  }
  return;
}

Assistant:

void GlobOpt::TrackIntSpecializedAddSubConstant(
    IR::Instr *const instr,
    const AddSubConstantInfo *const addSubConstantInfo,
    Value *const dstValue,
    const bool updateSourceBounds)
{
    Assert(instr);
    Assert(dstValue);

    if(addSubConstantInfo)
    {
        Assert(addSubConstantInfo->HasInfo());
        Assert(!ignoredIntOverflowForCurrentInstr);
        do
        {
            if(!IsLoopPrePass() || !DoBoundCheckHoist())
            {
                break;
            }

            Assert(
                instr->m_opcode == Js::OpCode::Incr_A ||
                instr->m_opcode == Js::OpCode::Decr_A ||
                instr->m_opcode == Js::OpCode::Add_A ||
                instr->m_opcode == Js::OpCode::Sub_A);

            StackSym *sym = instr->GetDst()->AsRegOpnd()->m_sym;
            bool isPostfixIncDecPattern = false;
            if(addSubConstantInfo->SrcSym() != sym)
            {
                // Check for the following patterns.
                //
                // This pattern is used for postfix inc/dec operators:
                //     s2 = Conv_Num s1
                //     s1 = Inc s2
                //
                // This pattern is used for prefix inc/dec operators:
                //     s2 = Inc s1
                //     s1 = Ld s2
                IR::Instr *const prevInstr = instr->m_prev;
                Assert(prevInstr);
                if(prevInstr->m_opcode == Js::OpCode::Conv_Num &&
                    prevInstr->GetSrc1()->IsRegOpnd() &&
                    prevInstr->GetSrc1()->AsRegOpnd()->m_sym == sym &&
                    prevInstr->GetDst()->AsRegOpnd()->m_sym == addSubConstantInfo->SrcSym())
                {
                    // s2 will get a new value number, since Conv_Num cannot transfer in the prepass. For the purposes of
                    // induction variable tracking however, it doesn't matter, so record this case and use s1's value in the
                    // current block.
                    isPostfixIncDecPattern = true;
                }
                else
                {
                    IR::Instr *const nextInstr = instr->m_next;
                    Assert(nextInstr);
                    if(nextInstr->m_opcode != Js::OpCode::Ld_A ||
                        !nextInstr->GetSrc1()->IsRegOpnd() ||
                        nextInstr->GetSrc1()->AsRegOpnd()->m_sym != sym)
                    {
                        break;
                    }
                    sym = addSubConstantInfo->SrcSym();
                    if(nextInstr->GetDst()->AsRegOpnd()->m_sym != sym)
                    {
                        break;
                    }

                    // In the prefix inc/dec pattern, the result of Ld currently gets a new value number, which will cause the
                    // induction variable info to become indeterminate. Indicate that the value number should be updated in the
                    // induction variable info.
                    // Consider: Remove this once loop prepass value transfer scheme is fixed
                    updateInductionVariableValueNumber = true;
                }
            }

            // Track induction variable info
            ValueNumber srcValueNumber;
            if(isPostfixIncDecPattern)
            {
                Value *const value = this->currentBlock->globOptData.FindValue(sym);
                Assert(value);
                srcValueNumber = value->GetValueNumber();
            }
            else
            {
                srcValueNumber = addSubConstantInfo->SrcValue()->GetValueNumber();
            }
            InductionVariableSet *const inductionVariables = currentBlock->globOptData.inductionVariables;
            Assert(inductionVariables);
            InductionVariable *inductionVariable;
            if(!inductionVariables->TryGetReference(sym->m_id, &inductionVariable))
            {
                // Only track changes in the current loop's prepass. In subsequent prepasses, the info is only being propagated
                // for use by the parent loop, so changes in the current loop have already been tracked.
                if(prePassLoop != currentBlock->loop)
                {
                    updateInductionVariableValueNumber = false;
                    break;
                }

                // Ensure that the sym is live in the landing pad, and that its value has not changed in an unknown way yet
                Value *const landingPadValue = currentBlock->loop->landingPad->globOptData.FindValue(sym);
                if(!landingPadValue || srcValueNumber != landingPadValue->GetValueNumber() || currentBlock->loop->symsDefInLoop->Test(sym->m_id))
                {
                    updateInductionVariableValueNumber = false;
                    break;
                }
                inductionVariables->Add(
                    InductionVariable(sym, dstValue->GetValueNumber(), addSubConstantInfo->Offset()));
                break;
            }

            if(!inductionVariable->IsChangeDeterminate())
            {
                updateInductionVariableValueNumber = false;
                break;
            }

            if(srcValueNumber != inductionVariable->SymValueNumber())
            {
                // The sym's value has changed since the last time induction variable info was recorded for it. Due to the
                // unknown change, mark the info as indeterminate.
                inductionVariable->SetChangeIsIndeterminate();
                updateInductionVariableValueNumber = false;
                break;
            }

            // Only track changes in the current loop's prepass. In subsequent prepasses, the info is only being propagated for
            // use by the parent loop, so changes in the current loop have already been tracked. Induction variable value
            // numbers are updated as changes occur, but their change bounds are preserved from the first prepass over the loop.
            inductionVariable->SetSymValueNumber(dstValue->GetValueNumber());
            if(prePassLoop != currentBlock->loop)
            {
                break;
            }

            if(!inductionVariable->Add(addSubConstantInfo->Offset()))
            {
                updateInductionVariableValueNumber = false;
            }
        } while(false);

        if(!this->IsLoopPrePass() && updateSourceBounds && addSubConstantInfo->Offset() != IntConstMin)
        {
            // Track bounds for add or sub with a constant. For instance, consider (b = a + 2). The value of 'b' should track
            // that it is equal to (the value of 'a') + 2. That part has been done above. Similarly, the value of 'a' should
            // also track that it is equal to (the value of 'b') - 2.
            Value *const value = addSubConstantInfo->SrcValue();
            const ValueInfo *const valueInfo = value->GetValueInfo();
            Assert(valueInfo->IsInt());
            IntConstantBounds constantBounds;
            AssertVerify(valueInfo->TryGetIntConstantBounds(&constantBounds));
            IntBounds *const bounds =
                GetIntBoundsToUpdate(
                    valueInfo,
                    constantBounds,
                    true,
                    dstValue->GetValueInfo()->HasIntConstantValue(),
                    true,
                    true);
            if(bounds)
            {
                const ValueNumber valueNumber = value->GetValueNumber();
                const int32 dstOffset = -addSubConstantInfo->Offset();
                bounds->SetLowerBound(valueNumber, dstValue, dstOffset, true);
                bounds->SetUpperBound(valueNumber, dstValue, dstOffset, true);
                ChangeValueInfo(nullptr, value, NewIntBoundedValueInfo(valueInfo, bounds));
            }
        }
        return;
    }

    if(!updateInductionVariableValueNumber)
    {
        return;
    }

    // See comment above where this is set to true
    // Consider: Remove this once loop prepass value transfer scheme is fixed
    updateInductionVariableValueNumber = false;

    Assert(IsLoopPrePass());
    Assert(instr->m_opcode == Js::OpCode::Ld_A);
    Assert(
        instr->m_prev->m_opcode == Js::OpCode::Incr_A ||
        instr->m_prev->m_opcode == Js::OpCode::Decr_A ||
        instr->m_prev->m_opcode == Js::OpCode::Add_A ||
        instr->m_prev->m_opcode == Js::OpCode::Sub_A);
    Assert(instr->m_prev->GetDst()->AsRegOpnd()->m_sym == instr->GetSrc1()->AsRegOpnd()->m_sym);

    InductionVariable *inductionVariable;
    AssertVerify(currentBlock->globOptData.inductionVariables->TryGetReference(instr->GetDst()->AsRegOpnd()->m_sym->m_id, &inductionVariable));
    inductionVariable->SetSymValueNumber(dstValue->GetValueNumber());
}